

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Maze.cpp
# Opt level: O0

void __thiscall Maze::startCellEndCells(Maze *this)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  reference this_00;
  long local_b0;
  tuple<unsigned_long,_int> local_a8;
  long local_98;
  tuple<unsigned_long,_int> local_90;
  int local_7c;
  tuple<int,_int> local_78;
  int local_70;
  tuple<int,_int> local_6c;
  int local_64;
  long lStack_60;
  int i_1;
  tuple<int,_unsigned_long> local_58;
  long local_48;
  tuple<int,_unsigned_long> local_40;
  undefined4 local_30;
  tuple<int,_int> local_2c;
  undefined4 local_24;
  tuple<int,_int> local_20;
  undefined8 local_18;
  int i;
  bool startFound;
  Maze *this_local;
  
  local_18._7_1_ = 0;
  _i = this;
  for (local_18._0_4_ = 0; uVar1 = (ulong)(int)local_18,
      sVar2 = std::
              vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
              ::size(&this->MazeMatrix), uVar1 < sVar2; local_18._0_4_ = (int)local_18 + 1) {
    pvVar3 = std::
             vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ::at(&this->MazeMatrix,(long)(int)local_18);
    pvVar4 = std::vector<char,_std::allocator<char>_>::at(pvVar3,0);
    if (*pvVar4 == '0') {
      if ((local_18._7_1_ & 1) == 0) {
        local_24 = 0;
        std::make_tuple<int&,int>((int *)&local_20,(int *)&local_18);
        std::tuple<int,_int>::operator=(&this->startCell,&local_20);
        local_18._7_1_ = 1;
      }
      else {
        local_30 = 0;
        std::make_tuple<int&,int>((int *)&local_2c,(int *)&local_18);
        std::tuple<int,_int>::operator=(&this->endCell,&local_2c);
      }
    }
    pvVar3 = std::
             vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ::at(&this->MazeMatrix,(long)(int)local_18);
    this_00 = std::
              vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
              ::at(&this->MazeMatrix,(long)(int)local_18);
    sVar2 = std::vector<char,_std::allocator<char>_>::size(this_00);
    pvVar4 = std::vector<char,_std::allocator<char>_>::at(pvVar3,sVar2 - 1);
    if (*pvVar4 == '0') {
      if ((local_18._7_1_ & 1) == 0) {
        pvVar3 = std::
                 vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 ::at(&this->MazeMatrix,(long)(int)local_18);
        sVar2 = std::vector<char,_std::allocator<char>_>::size(pvVar3);
        local_48 = sVar2 - 1;
        std::make_tuple<int&,unsigned_long>((int *)&local_40,&local_18);
        std::tuple<int,int>::operator=((tuple<int,int> *)&this->startCell,&local_40);
        local_18._7_1_ = 1;
      }
      else {
        pvVar3 = std::
                 vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 ::at(&this->MazeMatrix,(long)(int)local_18);
        sVar2 = std::vector<char,_std::allocator<char>_>::size(pvVar3);
        lStack_60 = sVar2 - 1;
        std::make_tuple<int&,unsigned_long>((int *)&local_58,&local_18);
        std::tuple<int,int>::operator=((tuple<int,int> *)&this->endCell,&local_58);
      }
    }
  }
  local_64 = 0;
  while( true ) {
    uVar1 = (ulong)local_64;
    pvVar3 = std::
             vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ::at(&this->MazeMatrix,0);
    sVar2 = std::vector<char,_std::allocator<char>_>::size(pvVar3);
    if (sVar2 <= uVar1) break;
    pvVar3 = std::
             vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ::at(&this->MazeMatrix,0);
    pvVar4 = std::vector<char,_std::allocator<char>_>::at(pvVar3,(long)local_64);
    if (*pvVar4 == '0') {
      if ((local_18._7_1_ & 1) == 0) {
        local_70 = 0;
        std::make_tuple<int,int&>((int *)&local_6c,&local_70);
        std::tuple<int,_int>::operator=(&this->startCell,&local_6c);
        local_18._7_1_ = 1;
      }
      else {
        local_7c = 0;
        std::make_tuple<int,int&>((int *)&local_78,&local_7c);
        std::tuple<int,_int>::operator=(&this->endCell,&local_78);
      }
    }
    sVar2 = std::
            vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
            ::size(&this->MazeMatrix);
    pvVar3 = std::
             vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ::at(&this->MazeMatrix,sVar2 - 1);
    pvVar4 = std::vector<char,_std::allocator<char>_>::at(pvVar3,(long)local_64);
    if (*pvVar4 == '0') {
      if ((local_18._7_1_ & 1) == 0) {
        sVar2 = std::
                vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                ::size(&this->MazeMatrix);
        local_98 = sVar2 - 1;
        std::make_tuple<unsigned_long,int&>((unsigned_long *)&local_90,(int *)&local_98);
        std::tuple<int,int>::operator=((tuple<int,int> *)&this->startCell,&local_90);
        local_18._7_1_ = 1;
      }
      else {
        sVar2 = std::
                vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                ::size(&this->MazeMatrix);
        local_b0 = sVar2 - 1;
        std::make_tuple<unsigned_long,int&>((unsigned_long *)&local_a8,(int *)&local_b0);
        std::tuple<int,int>::operator=((tuple<int,int> *)&this->endCell,&local_a8);
      }
    }
    local_64 = local_64 + 1;
  }
  return;
}

Assistant:

void Maze::startCellEndCells() {
//looks for the start cell and the end cell.
//scans the edges, and picks the first one it comes accoss as the start cell. The next one
// would be the ending cell.


    bool startFound = false;
    for(int i = 0; i < MazeMatrix.size(); i++)
    {
        if(MazeMatrix.at(i).at(0) == '0'){
            if(!startFound){
                startCell = std::make_tuple (i,0);
                startFound = true;
            }
            else{
                endCell = std::make_tuple(i,0);
            }
        }
        if(MazeMatrix.at(i).at(MazeMatrix.at(i).size()-1) == '0'){
            if(!startFound){
                startCell = std::make_tuple (i,MazeMatrix.at(i).size()-1);
                startFound = true;
            }
            else{
                endCell = std::make_tuple(i,MazeMatrix.at(i).size()-1);
            }
        }
    }
    //checking top and bottom
    for(int i = 0; i < MazeMatrix.at(0).size(); i++){
        if(MazeMatrix.at(0).at(i) == '0'){
            if(!startFound){
                startCell = std::make_tuple (0, i);
                startFound = true;
            }
            else{
                endCell = std::make_tuple(0, i);
            }
        }
        if(MazeMatrix.at(MazeMatrix.size() -1).at(i) == '0'){
            if(!startFound){
                startCell = std::make_tuple(MazeMatrix.size()-1, i);
                startFound = true;
            }
            else {
                endCell = std::make_tuple(MazeMatrix.size() - 1, i);
            }

        }

    }
 }